

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

void fy_node_clear_meta_internal(fy_node *fyn)

{
  byte bVar1;
  fy_node_pair *pfVar2;
  fy_node_pair *fynpi;
  fy_node_pair *fynp;
  fy_node *fyni;
  fy_node *fyn_local;
  
  if (fyn != (fy_node *)0x0) {
    bVar1 = fyn->field_0x34 & 3;
    if ((fyn->field_0x34 & 3) != 0) {
      if (bVar1 == 1) {
        for (fynp = (fy_node_pair *)fy_node_list_head(&(fyn->field_12).sequence);
            fynp != (fy_node_pair *)0x0;
            fynp = (fy_node_pair *)fy_node_next(&(fyn->field_12).sequence,(fy_node *)fynp)) {
          fy_node_clear_meta_internal((fy_node *)fynp);
        }
      }
      else if (bVar1 == 2) {
        fynpi = fy_node_pair_list_head(&(fyn->field_12).mapping);
        while (fynpi != (fy_node_pair *)0x0) {
          pfVar2 = fy_node_pair_next(&(fyn->field_12).mapping,fynpi);
          fy_node_clear_meta_internal(fynpi->key);
          fy_node_clear_meta_internal(fynpi->value);
          fynpi = pfVar2;
        }
      }
    }
    fy_node_clear_meta(fyn);
  }
  return;
}

Assistant:

static void fy_node_clear_meta_internal(struct fy_node *fyn) {
    struct fy_node *fyni;
    struct fy_node_pair *fynp, *fynpi;

    if (!fyn)
        return;

    switch (fyn->type) {
        case FYNT_SCALAR:
            break;

        case FYNT_SEQUENCE:
            for (fyni = fy_node_list_head(&fyn->sequence); fyni;
                 fyni = fy_node_next(&fyn->sequence, fyni)) {

                fy_node_clear_meta_internal(fyni);
            }
            break;

        case FYNT_MAPPING:
            for (fynp = fy_node_pair_list_head(&fyn->mapping); fynp; fynp = fynpi) {

                fynpi = fy_node_pair_next(&fyn->mapping, fynp);

                fy_node_clear_meta_internal(fynp->key);
                fy_node_clear_meta_internal(fynp->value);
            }
            break;
    }

    fy_node_clear_meta(fyn);
}